

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typemapper.hpp
# Opt level: O1

void jsonrpccxx::check_param_type<int>(size_t index,json *x,value_t expectedType,type *param_4)

{
  value_t vVar1;
  JsonRpcException *pJVar2;
  long *plVar3;
  size_type *psVar4;
  value_t t;
  value_t t_00;
  undefined7 in_register_00000011;
  pointer pcVar5;
  longlong ret;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  size_t local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_58;
  string local_48;
  
  local_a0 = index;
  if (((int)CONCAT71(in_register_00000011,expectedType) == 6) && (x->m_type == number_integer)) {
    local_c0._M_dataplus._M_p = (pointer)0x0;
    nlohmann::detail::
    from_json<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_long_long,_0>
              (x,(longlong *)&local_c0);
    if (-1 < (long)local_c0._M_dataplus._M_p) {
      return;
    }
    pJVar2 = (JsonRpcException *)__cxa_allocate_exception(0x60);
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"unsigned integer","");
    std::operator+(&local_98,"invalid parameter: must be ",&local_78);
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_98);
    local_e0._M_dataplus._M_p = (pointer)*plVar3;
    psVar4 = (size_type *)(plVar3 + 2);
    if ((size_type *)local_e0._M_dataplus._M_p == psVar4) {
      local_e0.field_2._M_allocated_capacity = *psVar4;
      local_e0.field_2._8_8_ = plVar3[3];
      local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
    }
    else {
      local_e0.field_2._M_allocated_capacity = *psVar4;
    }
    local_e0._M_string_length = plVar3[1];
    *plVar3 = (long)psVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    type_name_abi_cxx11_
              (&local_48,(jsonrpccxx *)(ulong)x->m_type,(value_t)local_e0._M_string_length);
    std::operator+(&local_c0,&local_e0,&local_48);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::basic_json<unsigned_long_&,_unsigned_long,_0>(&local_58,&local_a0);
    JsonRpcException::JsonRpcException(pJVar2,-0x7f5a,&local_c0,&local_58);
    __cxa_throw(pJVar2,&JsonRpcException::typeinfo,JsonRpcException::~JsonRpcException);
  }
  vVar1 = x->m_type;
  if (expectedType == number_integer && vVar1 == number_unsigned) {
    local_c0._M_dataplus._M_p = (pointer)0x0;
    nlohmann::detail::
    from_json<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_unsigned_long_long,_0>
              (x,(unsigned_long_long *)&local_c0);
    if ((ulong)local_c0._M_dataplus._M_p >> 0x1f == 0) {
      return;
    }
    pJVar2 = (JsonRpcException *)__cxa_allocate_exception(0x60);
    local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
    local_e0._M_string_length = 7;
    local_e0.field_2._M_allocated_capacity = 0x72656765746e69;
    std::operator+(&local_c0,"invalid parameter: exceeds value range of ",&local_e0);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::basic_json<unsigned_long_&,_unsigned_long,_0>
              ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)&local_98,&local_a0);
    JsonRpcException::JsonRpcException(pJVar2,-0x7f5a,&local_c0,(json *)&local_98);
    __cxa_throw(pJVar2,&JsonRpcException::typeinfo,JsonRpcException::~JsonRpcException);
  }
  if (vVar1 == number_unsigned) {
    if (expectedType == number_float) {
LAB_0013f3ec:
      local_c0._M_dataplus._M_p = (pointer)0x0;
      nlohmann::detail::
      get_arithmetic_value<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_double,_0>
                (x,(double *)&local_c0);
      pcVar5 = (pointer)(long)local_c0._M_dataplus._M_p;
      local_c0._M_dataplus._M_p = (pointer)0x0;
      nlohmann::detail::
      from_json<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_long_long,_0>
                (x,(longlong *)&local_c0);
      if (local_c0._M_dataplus._M_p == pcVar5) {
        return;
      }
      pJVar2 = (JsonRpcException *)__cxa_allocate_exception(0x60);
      type_name_abi_cxx11_(&local_e0,(jsonrpccxx *)(ulong)expectedType,t_00);
      std::operator+(&local_c0,"invalid parameter: exceeds value range of ",&local_e0);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::basic_json<unsigned_long_&,_unsigned_long,_0>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  *)&local_98,&local_a0);
      JsonRpcException::JsonRpcException(pJVar2,-0x7f5a,&local_c0,(json *)&local_98);
      __cxa_throw(pJVar2,&JsonRpcException::typeinfo,JsonRpcException::~JsonRpcException);
    }
  }
  else if (expectedType == number_float && vVar1 == number_integer) goto LAB_0013f3ec;
  if (vVar1 == expectedType) {
    return;
  }
  pJVar2 = (JsonRpcException *)__cxa_allocate_exception(0x60);
  type_name_abi_cxx11_(&local_78,(jsonrpccxx *)(ulong)expectedType,t);
  std::operator+(&local_98,"invalid parameter: must be ",&local_78);
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_98);
  local_e0._M_dataplus._M_p = (pointer)*plVar3;
  psVar4 = (size_type *)(plVar3 + 2);
  if ((size_type *)local_e0._M_dataplus._M_p == psVar4) {
    local_e0.field_2._M_allocated_capacity = *psVar4;
    local_e0.field_2._8_8_ = plVar3[3];
    local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
  }
  else {
    local_e0.field_2._M_allocated_capacity = *psVar4;
  }
  local_e0._M_string_length = plVar3[1];
  *plVar3 = (long)psVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  type_name_abi_cxx11_(&local_48,(jsonrpccxx *)(ulong)x->m_type,(value_t)local_e0._M_string_length);
  std::operator+(&local_c0,&local_e0,&local_48);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::basic_json<unsigned_long_&,_unsigned_long,_0>(&local_58,&local_a0);
  JsonRpcException::JsonRpcException(pJVar2,-0x7f5a,&local_c0,&local_58);
  __cxa_throw(pJVar2,&JsonRpcException::typeinfo,JsonRpcException::~JsonRpcException);
}

Assistant:

inline void check_param_type(size_t index, const json &x, json::value_t expectedType, typename std::enable_if<std::is_arithmetic<T>::value>::type * = 0) {
    if (expectedType == json::value_t::number_unsigned && x.type() == json::value_t::number_integer) {
      if (x.get<long long int>() < 0)
        throw JsonRpcException(invalid_params, "invalid parameter: must be " + type_name(expectedType) + ", but is " + type_name(x.type()), index);
    } else if (x.type() == json::value_t::number_unsigned && expectedType == json::value_t::number_integer) {
      if (x.get<long long unsigned>() > (long long unsigned)std::numeric_limits<T>::max()) {
        throw JsonRpcException(invalid_params, "invalid parameter: exceeds value range of " + type_name(expectedType), index);
      }
    }
    else if ((x.type() == json::value_t::number_unsigned || x.type() == json::value_t::number_integer) && expectedType == json::value_t::number_float) {
      if (static_cast<long long int>(x.get<double>()) != x.get<long long int>()) {
        throw JsonRpcException(invalid_params, "invalid parameter: exceeds value range of " + type_name(expectedType), index);
      }
    } else if (x.type() != expectedType) {
      throw JsonRpcException(invalid_params, "invalid parameter: must be " + type_name(expectedType) + ", but is " + type_name(x.type()), index);
    }
  }